

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall irr::video::COpenGL3DriverBase::setRenderStates3DMode(COpenGL3DriverBase *this)

{
  E_MATERIAL_TYPE EVar1;
  pointer pSVar2;
  IMaterialRenderer *pIVar3;
  u32 uVar4;
  u32 uVar5;
  u32 uVar6;
  u8 uVar7;
  undefined2 uVar8;
  f32 fVar9;
  f32 fVar10;
  f32 fVar11;
  SColor SVar12;
  f32 fVar13;
  f32 fVar14;
  f32 fVar15;
  bool bVar16;
  long lVar17;
  COpenGL3CacheHandler *pCVar18;
  SMaterialLayer *other;
  
  if (this->LockRenderStateMode != false) {
    return;
  }
  if (this->CurrentRenderMode == ERM_3D) {
    if (((this->ResetRenderStates & 1U) == 0) &&
       (bVar16 = SMaterial::operator!=(&this->LastMaterial,&this->Material), !bVar16))
    goto LAB_001f0f11;
  }
  else {
    pCVar18 = this->CacheHandler;
    if ((*pCVar18->Blend != false) || (pCVar18->BlendInvalid == true)) {
      (*GL.Disable)(0xbe2);
      if ((ulong)pCVar18->FrameBufferCount != 0) {
        memset(pCVar18->Blend,0,(ulong)pCVar18->FrameBufferCount);
      }
      pCVar18->BlendInvalid = false;
      pCVar18 = this->CacheHandler;
    }
    COpenGLCoreCacheHandler<irr::video::COpenGL3DriverBase,_irr::video::COpenGLCoreTexture<irr::video::COpenGL3DriverBase>_>
    ::setBlendFunc(pCVar18,0x302,0x303);
    this->ResetRenderStates = true;
  }
  if ((this->CurrentRenderMode == ERM_2D) &&
     (this->MaterialRenderer2DActive != (COpenGL3Renderer2D *)0x0)) {
    (*(this->MaterialRenderer2DActive->super_COpenGL3MaterialRenderer).super_IMaterialRenderer.
      _vptr_IMaterialRenderer[2])();
    this->MaterialRenderer2DActive = (COpenGL3Renderer2D *)0x0;
  }
  else {
    EVar1 = (this->LastMaterial).MaterialType;
    if ((EVar1 != (this->Material).MaterialType) &&
       (pSVar2 = (this->super_CNullDriver).MaterialRenderers.m_data.
                 super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       EVar1 < (uint)((int)((ulong)((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                                          super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2)
                           >> 3) * -0x33333333))) {
      (*(pSVar2[EVar1].Renderer)->_vptr_IMaterialRenderer[2])();
    }
  }
  other = (this->Material).TextureLayers;
  EVar1 = (this->Material).MaterialType;
  pSVar2 = (this->super_CNullDriver).MaterialRenderers.m_data.
           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (EVar1 < (uint)((int)((ulong)((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                                         super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2)
                          >> 3) * -0x33333333)) {
    pIVar3 = pSVar2[EVar1].Renderer;
    (**pIVar3->_vptr_IMaterialRenderer)
              (pIVar3,other,&this->LastMaterial,(ulong)this->ResetRenderStates,
               &(this->super_CNullDriver).field_0x490);
  }
  lVar17 = 4;
  do {
    SMaterialLayer::operator=((SMaterialLayer *)&other[5].TextureMatrix,other);
    other = other + 1;
    lVar17 = lVar17 + -1;
  } while (lVar17 != 0);
  *(undefined2 *)&(this->LastMaterial).field_0xb0 = *(undefined2 *)&(this->Material).field_0xb0;
  EVar1 = (this->Material).MaterialType;
  uVar4 = (this->Material).AmbientColor.color;
  uVar5 = (this->Material).DiffuseColor.color;
  uVar6 = (this->Material).EmissiveColor.color;
  SVar12.color = (this->Material).SpecularColor.color;
  fVar13 = (this->Material).Shininess;
  fVar14 = (this->Material).MaterialTypeParam;
  fVar15 = (this->Material).Thickness;
  uVar7 = (this->Material).AntiAliasing;
  uVar8 = *(undefined2 *)&(this->Material).field_0xa2;
  fVar9 = (this->Material).BlendFactor;
  fVar10 = (this->Material).PolygonOffsetDepthBias;
  fVar11 = (this->Material).PolygonOffsetSlopeScale;
  (this->LastMaterial).ZBuffer = (this->Material).ZBuffer;
  (this->LastMaterial).AntiAliasing = uVar7;
  *(undefined2 *)&(this->LastMaterial).field_0xa2 = uVar8;
  (this->LastMaterial).BlendFactor = fVar9;
  (this->LastMaterial).PolygonOffsetDepthBias = fVar10;
  (this->LastMaterial).PolygonOffsetSlopeScale = fVar11;
  (this->LastMaterial).SpecularColor = (SColor)SVar12.color;
  (this->LastMaterial).Shininess = fVar13;
  (this->LastMaterial).MaterialTypeParam = fVar14;
  (this->LastMaterial).Thickness = fVar15;
  (this->LastMaterial).MaterialType = EVar1;
  (this->LastMaterial).AmbientColor.color = uVar4;
  (this->LastMaterial).DiffuseColor.color = uVar5;
  (this->LastMaterial).EmissiveColor.color = uVar6;
  pCVar18 = this->CacheHandler;
  lVar17 = 0;
  do {
    if ((*(long *)((long)&(this->LastMaterial).TextureLayers[0].Texture + lVar17 * 4) != 0) &&
       (*(long *)((long)(pCVar18->TextureCache).Texture + lVar17) == 0)) {
      *(undefined8 *)((long)&(this->LastMaterial).TextureLayers[0].Texture + lVar17 * 4) = 0;
    }
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x20);
  this->ResetRenderStates = false;
LAB_001f0f11:
  EVar1 = (this->Material).MaterialType;
  pSVar2 = (this->super_CNullDriver).MaterialRenderers.m_data.
           super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (EVar1 < (uint)((int)((ulong)((long)(this->super_CNullDriver).MaterialRenderers.m_data.
                                         super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2)
                          >> 3) * -0x33333333)) {
    pIVar3 = pSVar2[EVar1].Renderer;
    (*pIVar3->_vptr_IMaterialRenderer[1])(pIVar3,&(this->super_CNullDriver).field_0x490,0);
  }
  this->CurrentRenderMode = ERM_3D;
  return;
}

Assistant:

void COpenGL3DriverBase::setRenderStates3DMode()
{
	if (LockRenderStateMode)
		return;

	if (CurrentRenderMode != ERM_3D) {
		// Reset Texture Stages
		CacheHandler->setBlend(false);
		CacheHandler->setBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

		ResetRenderStates = true;
	}

	if (ResetRenderStates || LastMaterial != Material) {
		// unset old material

		// unset last 3d material
		if (CurrentRenderMode == ERM_2D && MaterialRenderer2DActive) {
			MaterialRenderer2DActive->OnUnsetMaterial();
			MaterialRenderer2DActive = 0;
		} else if (LastMaterial.MaterialType != Material.MaterialType &&
				   static_cast<u32>(LastMaterial.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[LastMaterial.MaterialType].Renderer->OnUnsetMaterial();

		// set new material.
		if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
			MaterialRenderers[Material.MaterialType].Renderer->OnSetMaterial(
					Material, LastMaterial, ResetRenderStates, this);

		LastMaterial = Material;
		CacheHandler->correctCacheMaterial(LastMaterial);
		ResetRenderStates = false;
	}

	if (static_cast<u32>(Material.MaterialType) < MaterialRenderers.size())
		MaterialRenderers[Material.MaterialType].Renderer->OnRender(this, video::EVT_STANDARD);

	CurrentRenderMode = ERM_3D;
}